

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BinaryExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::BinaryExpression,slang::ast::BinaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&,slang::SourceRange&>
          (BumpAllocator *this,BinaryOperator *args,Type *args_1,Expression *args_2,
          Expression *args_3,SourceRange *args_4,SourceRange *args_5)

{
  BinaryOperator BVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  SourceLocation SVar5;
  BinaryExpression *pBVar6;
  
  pBVar6 = (BinaryExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BinaryExpression *)this->endPtr < pBVar6 + 1) {
    pBVar6 = (BinaryExpression *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pBVar6 + 1);
  }
  BVar1 = *args;
  SVar2 = args_4->startLoc;
  SVar3 = args_4->endLoc;
  SVar4 = args_5->startLoc;
  SVar5 = args_5->endLoc;
  (pBVar6->super_Expression).kind = BinaryOp;
  (pBVar6->super_Expression).type.ptr = args_1;
  (pBVar6->super_Expression).constant = (ConstantValue *)0x0;
  (pBVar6->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pBVar6->super_Expression).sourceRange.startLoc = SVar2;
  (pBVar6->super_Expression).sourceRange.endLoc = SVar3;
  pBVar6->left_ = args_2;
  pBVar6->right_ = args_3;
  pBVar6->op = BVar1;
  (pBVar6->opRange).startLoc = SVar4;
  (pBVar6->opRange).endLoc = SVar5;
  return pBVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }